

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

void __thiscall
icu_63::NFRuleSet::NFRuleSet
          (NFRuleSet *this,RuleBasedNumberFormat *_owner,UnicodeString *descriptions,int32_t index,
          UErrorCode *status)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  int8_t iVar4;
  ushort uVar5;
  uint uVar6;
  int32_t iVar7;
  NFRule **ppNVar8;
  char16_t *pcVar9;
  int iVar10;
  uint c;
  uint uVar11;
  UnicodeString *this_01;
  long lVar12;
  ConstChar16Ptr local_98;
  undefined1 *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  this_00 = &this->name;
  (this->name).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (this->name).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->rules).fStuff = (NFRule **)0x0;
  (this->rules).fCount = 0;
  (this->rules).fCapacity = 0;
  this->owner = _owner;
  ppNVar8 = (NFRule **)uprv_malloc_63(0x50);
  (this->fractionRules).fStuff = ppNVar8;
  (this->fractionRules).fCount = 0;
  (this->fractionRules).fCapacity = 10;
  this->fIsFractionRuleSet = '\0';
  this->fIsPublic = '\0';
  this->fIsParseable = '\x01';
  this->nonNumericalRules[0] = (NFRule *)0x0;
  this->nonNumericalRules[1] = (NFRule *)0x0;
  this->nonNumericalRules[2] = (NFRule *)0x0;
  this->nonNumericalRules[3] = (NFRule *)0x0;
  this->nonNumericalRules[4] = (NFRule *)0x0;
  this->nonNumericalRules[5] = (NFRule *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = descriptions[index].fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar10 = descriptions[index].fUnion.fFields.fLength;
    }
    else {
      iVar10 = (int)sVar1 >> 5;
    }
    if (iVar10 == 0) {
      *status = U_PARSE_ERROR;
    }
    else {
      this_01 = descriptions + index;
      if (((int)sVar1 & 2U) == 0) {
        pcVar9 = (this_01->fUnion).fFields.fArray;
      }
      else {
        pcVar9 = (this_01->fUnion).fStackFields.fBuffer;
      }
      if (*pcVar9 == L'%') {
        uVar6 = UnicodeString::doIndexOf(this_01,L':',0,iVar10);
        if (uVar6 == 0xffffffff) {
          *status = U_PARSE_ERROR;
        }
        else {
          UnicodeString::unBogus(this_00);
          sVar1 = (this->name).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar7 = (this->name).fUnion.fFields.fLength;
          }
          else {
            iVar7 = (int)sVar1 >> 5;
          }
          UnicodeString::doReplace(this_00,0,iVar7,this_01,0,uVar6);
          lVar12 = (long)(int)uVar6;
          do {
            uVar6 = uVar6 + 1;
            sVar1 = (this_01->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              uVar11 = (this_01->fUnion).fFields.fLength;
            }
            else {
              uVar11 = (int)sVar1 >> 5;
            }
            if ((int)uVar11 <= lVar12) break;
            c = 0xffff;
            if (uVar6 < uVar11) {
              pcVar9 = (char16_t *)((long)&this_01->fUnion + 2);
              if (((int)sVar1 & 2U) == 0) {
                pcVar9 = (this_01->fUnion).fFields.fArray;
              }
              c = (uint)(ushort)pcVar9[lVar12 + 1];
            }
            UVar3 = PatternProps::isWhiteSpace(c);
            lVar12 = lVar12 + 1;
          } while (UVar3 != '\0');
          if ((int)lVar12 == 0x7fffffff) {
            uVar2 = (this_01->fUnion).fStackFields.fLengthAndFlags;
            uVar5 = 2;
            if ((uVar2 & 1) == 0) {
              uVar5 = uVar2 & 0x1e;
            }
            (this_01->fUnion).fStackFields.fLengthAndFlags = uVar5;
          }
          else {
            UnicodeString::doReplace(this_01,0,(int)lVar12,(UChar *)0x0,0,0);
          }
        }
      }
      else {
        local_98.p_ = L"%default";
        UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
        UnicodeString::copyFrom(this_00,&local_70,'\0');
        UnicodeString::~UnicodeString(&local_70);
        local_80 = local_98.p_;
      }
      sVar1 = (this_01->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar10 = (this_01->fUnion).fFields.fLength;
      }
      else {
        iVar10 = (int)sVar1 >> 5;
      }
      if (iVar10 == 0) {
        *status = U_PARSE_ERROR;
      }
      sVar1 = (this->name).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar6 = (this->name).fUnion.fFields.fLength;
      }
      else {
        uVar6 = (int)sVar1 >> 5;
      }
      uVar11 = (int)uVar6 >> 0x1f & uVar6;
      iVar7 = UnicodeString::indexOf(this_00,L"%%",0,2,uVar11,uVar6 - uVar11);
      this->fIsPublic = iVar7 != 0;
      sVar1 = (this->name).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar10 = (this->name).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)sVar1 >> 5;
      }
      iVar4 = UnicodeString::doCompare(this_00,iVar10 + -8,8,(UChar *)gNoparse,0,8);
      local_90 = gNoparse;
      if (iVar4 == '\0') {
        this->fIsParseable = '\0';
        uVar2 = (this->name).fUnion.fStackFields.fLengthAndFlags;
        if ((short)uVar2 < 0) {
          uVar6 = (this->name).fUnion.fFields.fLength;
        }
        else {
          uVar6 = (int)(short)uVar2 >> 5;
        }
        iVar10 = uVar6 - 8;
        if (iVar10 == 0 && (uVar2 & 1) != 0) {
          UnicodeString::unBogus(this_00);
        }
        else if (7 < uVar6) {
          if ((int)uVar6 < 0x408) {
            (this->name).fUnion.fStackFields.fLengthAndFlags = (short)iVar10 * 0x20 | uVar2 & 0x1f;
          }
          else {
            (this->name).fUnion.fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
            (this->name).fUnion.fFields.fLength = iVar10;
          }
        }
      }
    }
  }
  return;
}

Assistant:

NFRuleSet::NFRuleSet(RuleBasedNumberFormat *_owner, UnicodeString* descriptions, int32_t index, UErrorCode& status)
  : name()
  , rules(0)
  , owner(_owner)
  , fractionRules()
  , fIsFractionRuleSet(FALSE)
  , fIsPublic(FALSE)
  , fIsParseable(TRUE)
{
    for (int32_t i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        nonNumericalRules[i] = NULL;
    }

    if (U_FAILURE(status)) {
        return;
    }

    UnicodeString& description = descriptions[index]; // !!! make sure index is valid

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
        return;
    }

    // if the description begins with a rule set name (the rule set
    // name can be omitted in formatter descriptions that consist
    // of only one rule set), copy it out into our "name" member
    // and delete it from the description
    if (description.charAt(0) == gPercent) {
        int32_t pos = description.indexOf(gColon);
        if (pos == -1) {
            // throw new IllegalArgumentException("Rule set name doesn't end in colon");
            status = U_PARSE_ERROR;
        } else {
            name.setTo(description, 0, pos);
            while (pos < description.length() && PatternProps::isWhiteSpace(description.charAt(++pos))) {
            }
            description.remove(0, pos);
        }
    } else {
        name.setTo(UNICODE_STRING_SIMPLE("%default"));
    }

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
    }

    fIsPublic = name.indexOf(gPercentPercent, 2, 0) != 0;

    if ( name.endsWith(gNoparse,8) ) {
        fIsParseable = FALSE;
        name.truncate(name.length()-8); // remove the @noparse from the name
    }

    // all of the other members of NFRuleSet are initialized
    // by parseRules()
}